

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O0

void __thiscall soplex::CLUFactorRational::eliminateColSingletons(CLUFactorRational *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long in_RDI;
  Pring *sing;
  int prow;
  int pcol;
  int c;
  int m;
  int k;
  int j;
  int i;
  Rational *in_stack_000000e8;
  int in_stack_000000f4;
  int in_stack_000000f8;
  int in_stack_000000fc;
  CLUFactorRational *in_stack_00000100;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar8;
  undefined8 local_40;
  undefined4 local_24;
  undefined4 local_1c;
  
  for (local_40 = *(long *)(*(long *)(in_RDI + 0x298) + 0x28);
      local_40 != *(long *)(in_RDI + 0x298) + 0x20; local_40 = *(long *)(local_40 + 8)) {
    iVar8 = *(int *)(local_40 + 0x10);
    iVar3 = *(int *)(*(long *)(in_RDI + 0x210) + (long)iVar8 * 4) + -1;
    *(int *)(*(long *)(in_RDI + 0x210) + (long)iVar8 * 4) = iVar3;
    iVar3 = *(int *)(*(long *)(in_RDI + 0x1e8) +
                    (long)(iVar3 + *(int *)(*(long *)(in_RDI + 0x208) + (long)iVar8 * 4)) * 4);
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x2a0) + (long)iVar3 * 0x20) + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x2a0) + (long)iVar3 * 0x20 + 8);
    **(undefined8 **)(*(long *)(in_RDI + 0x2a0) + (long)iVar3 * 0x20 + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x2a0) + (long)iVar3 * 0x20);
    iVar4 = *(int *)(*(long *)(in_RDI + 0x1b0) + (long)iVar3 * 4) + -1;
    *(int *)(*(long *)(in_RDI + 0x1b0) + (long)iVar3 * 4) = iVar4;
    iVar4 = iVar4 + *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar3 * 4);
    local_1c = iVar4;
    while (iVar1 = *(int *)(*(long *)(in_RDI + 0x1a0) + (long)local_1c * 4), iVar1 != iVar8) {
      iVar2 = *(int *)(*(long *)(in_RDI + 0x210) + (long)iVar1 * 4);
      iVar6 = *(int *)(*(long *)(in_RDI + 0x208) + (long)iVar1 * 4);
      iVar5 = *(int *)(*(long *)(in_RDI + 0x260) + (long)iVar1 * 4);
      *(int *)(*(long *)(in_RDI + 0x260) + (long)iVar1 * 4) = iVar5 + -1;
      iVar5 = (iVar2 + iVar6) - iVar5;
      local_24 = iVar5;
      while (*(int *)(*(long *)(in_RDI + 0x1e8) + (long)local_24 * 4) != iVar3) {
        local_24 = local_24 + 1;
      }
      *(undefined4 *)(*(long *)(in_RDI + 0x1e8) + (long)local_24 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 0x1e8) + (long)iVar5 * 4);
      *(int *)(*(long *)(in_RDI + 0x1e8) + (long)iVar5 * 4) = iVar3;
      iVar2 = *(int *)(*(long *)(in_RDI + 0x260) + (long)iVar1 * 4);
      *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x290) + (long)iVar1 * 0x20) + 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x290) + (long)iVar1 * 0x20 + 8);
      **(undefined8 **)(*(long *)(in_RDI + 0x290) + (long)iVar1 * 0x20 + 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x290) + (long)iVar1 * 0x20);
      *(undefined8 *)(*(long *)(in_RDI + 0x290) + (long)iVar1 * 0x20) =
           *(undefined8 *)(*(long *)(in_RDI + 0x298) + (long)iVar2 * 0x20);
      *(long *)(*(long *)(*(long *)(in_RDI + 0x290) + (long)iVar1 * 0x20) + 8) =
           *(long *)(in_RDI + 0x290) + (long)iVar1 * 0x20;
      *(long *)(*(long *)(in_RDI + 0x290) + (long)iVar1 * 0x20 + 8) =
           *(long *)(in_RDI + 0x298) + (long)iVar2 * 0x20;
      *(long *)(*(long *)(in_RDI + 0x298) + (long)iVar2 * 0x20) =
           *(long *)(in_RDI + 0x290) + (long)iVar1 * 0x20;
      local_1c = local_1c + -1;
    }
    iVar8 = *(int *)(in_RDI + 0x268);
    *(int *)(in_RDI + 0x268) = iVar8 + 1;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT44(iVar8,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
    setPivot(in_stack_00000100,in_stack_000000fc,in_stack_000000f8,in_stack_000000f4,
             in_stack_000000e8);
    *(undefined4 *)(*(long *)(in_RDI + 0x1a0) + (long)local_1c * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x1a0) + (long)iVar4 * 4);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT44(iVar8,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT44(iVar8,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(iVar8,in_stack_ffffffffffffffa0),
                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    iVar8 = *(int *)(*(long *)(in_RDI + 0x1a8) + (long)iVar3 * 4);
    while (local_1c = local_1c + -1, iVar8 <= local_1c) {
      iVar4 = *(int *)(*(long *)(in_RDI + 0x1a0) + (long)local_1c * 4);
      iVar1 = *(int *)(*(long *)(in_RDI + 0x210) + (long)iVar4 * 4);
      iVar2 = *(int *)(*(long *)(in_RDI + 0x208) + (long)iVar4 * 4);
      iVar6 = *(int *)(*(long *)(in_RDI + 0x260) + (long)iVar4 * 4);
      *(int *)(*(long *)(in_RDI + 0x260) + (long)iVar4 * 4) = iVar6 + -1;
      iVar6 = (iVar1 + iVar2) - iVar6;
      local_24 = iVar6;
      while (*(int *)(*(long *)(in_RDI + 0x1e8) + (long)local_24 * 4) != iVar3) {
        local_24 = local_24 + 1;
      }
      *(undefined4 *)(*(long *)(in_RDI + 0x1e8) + (long)local_24 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 0x1e8) + (long)iVar6 * 4);
      *(int *)(*(long *)(in_RDI + 0x1e8) + (long)iVar6 * 4) = iVar3;
      iVar1 = *(int *)(*(long *)(in_RDI + 0x260) + (long)iVar4 * 4);
      *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x290) + (long)iVar4 * 0x20) + 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x290) + (long)iVar4 * 0x20 + 8);
      **(undefined8 **)(*(long *)(in_RDI + 0x290) + (long)iVar4 * 0x20 + 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x290) + (long)iVar4 * 0x20);
      *(undefined8 *)(*(long *)(in_RDI + 0x290) + (long)iVar4 * 0x20) =
           *(undefined8 *)(*(long *)(in_RDI + 0x298) + (long)iVar1 * 0x20);
      *(long *)(*(long *)(*(long *)(in_RDI + 0x290) + (long)iVar4 * 0x20) + 8) =
           *(long *)(in_RDI + 0x290) + (long)iVar4 * 0x20;
      *(long *)(*(long *)(in_RDI + 0x290) + (long)iVar4 * 0x20 + 8) =
           *(long *)(in_RDI + 0x298) + (long)iVar1 * 0x20;
      *(long *)(*(long *)(in_RDI + 0x298) + (long)iVar1 * 0x20) =
           *(long *)(in_RDI + 0x290) + (long)iVar4 * 0x20;
    }
  }
  lVar7 = *(long *)(in_RDI + 0x298) + 0x20;
  *(long *)(*(long *)(in_RDI + 0x298) + 0x20) = lVar7;
  *(long *)(*(long *)(in_RDI + 0x298) + 0x28) = lVar7;
  return;
}

Assistant:

inline void CLUFactorRational::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactorRational::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}